

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000251170 = 0x2d2d2d2d2d2d2d;
    uRam0000000000251177._0_1_ = '-';
    uRam0000000000251177._1_1_ = '-';
    uRam0000000000251177._2_1_ = '-';
    uRam0000000000251177._3_1_ = '-';
    uRam0000000000251177._4_1_ = '-';
    uRam0000000000251177._5_1_ = '-';
    uRam0000000000251177._6_1_ = '-';
    uRam0000000000251177._7_1_ = '-';
    DAT_00251160 = '-';
    DAT_00251160_1._0_1_ = '-';
    DAT_00251160_1._1_1_ = '-';
    DAT_00251160_1._2_1_ = '-';
    DAT_00251160_1._3_1_ = '-';
    DAT_00251160_1._4_1_ = '-';
    DAT_00251160_1._5_1_ = '-';
    DAT_00251160_1._6_1_ = '-';
    uRam0000000000251168 = 0x2d2d2d2d2d2d2d;
    DAT_0025116f = 0x2d;
    DAT_00251150 = '-';
    DAT_00251150_1._0_1_ = '-';
    DAT_00251150_1._1_1_ = '-';
    DAT_00251150_1._2_1_ = '-';
    DAT_00251150_1._3_1_ = '-';
    DAT_00251150_1._4_1_ = '-';
    DAT_00251150_1._5_1_ = '-';
    DAT_00251150_1._6_1_ = '-';
    uRam0000000000251158._0_1_ = '-';
    uRam0000000000251158._1_1_ = '-';
    uRam0000000000251158._2_1_ = '-';
    uRam0000000000251158._3_1_ = '-';
    uRam0000000000251158._4_1_ = '-';
    uRam0000000000251158._5_1_ = '-';
    uRam0000000000251158._6_1_ = '-';
    uRam0000000000251158._7_1_ = '-';
    DAT_00251140 = '-';
    DAT_00251140_1._0_1_ = '-';
    DAT_00251140_1._1_1_ = '-';
    DAT_00251140_1._2_1_ = '-';
    DAT_00251140_1._3_1_ = '-';
    DAT_00251140_1._4_1_ = '-';
    DAT_00251140_1._5_1_ = '-';
    DAT_00251140_1._6_1_ = '-';
    uRam0000000000251148._0_1_ = '-';
    uRam0000000000251148._1_1_ = '-';
    uRam0000000000251148._2_1_ = '-';
    uRam0000000000251148._3_1_ = '-';
    uRam0000000000251148._4_1_ = '-';
    uRam0000000000251148._5_1_ = '-';
    uRam0000000000251148._6_1_ = '-';
    uRam0000000000251148._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000251138._0_1_ = '-';
    uRam0000000000251138._1_1_ = '-';
    uRam0000000000251138._2_1_ = '-';
    uRam0000000000251138._3_1_ = '-';
    uRam0000000000251138._4_1_ = '-';
    uRam0000000000251138._5_1_ = '-';
    uRam0000000000251138._6_1_ = '-';
    uRam0000000000251138._7_1_ = '-';
    DAT_0025117f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}